

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O0

bool lpDimensionsOk(string *message,HighsLp *lp,HighsLogOptions *log_options)

{
  uint uVar1;
  uint uVar2;
  HighsStatus HVar3;
  undefined8 uVar4;
  size_type sVar5;
  size_type sVar6;
  size_type sVar7;
  HighsLogOptions *in_RDX;
  uint *in_RSI;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool legal_scale_col_size;
  bool legal_scale_row_size;
  bool legal_scale_num_row;
  bool legal_scale_num_col;
  HighsInt scale_col_size;
  HighsInt scale_row_size;
  bool legal_scale_strategy;
  HighsInt scale_strategy;
  bool legal_a_matrix_num_row;
  bool legal_a_matrix_num_col;
  bool legal_row_upper_size;
  bool legal_row_lower_size;
  HighsInt row_upper_size;
  HighsInt row_lower_size;
  bool legal_matrix_dimensions;
  vector<int,_std::allocator<int>_> a_matrix_p_end;
  bool partitioned;
  HighsInt num_vec;
  bool legal_format;
  bool legal_col_upper_size;
  bool legal_col_lower_size;
  bool legal_col_cost_size;
  HighsInt col_upper_size;
  HighsInt col_lower_size;
  HighsInt col_cost_size;
  HighsInt num_row;
  HighsInt num_col;
  bool ok;
  undefined4 uVar13;
  undefined8 uVar12;
  uint in_stack_fffffffffffffe00;
  uint uVar14;
  uint in_stack_fffffffffffffe04;
  char *local_1f0;
  bool local_1cd;
  uint local_1cc;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe38;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe40;
  char *pcVar15;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe48;
  HighsLogOptions *log_options_;
  undefined8 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  bool local_19d;
  uint local_19c;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe70;
  bool local_17d;
  uint local_17c;
  bool local_161;
  bool local_151;
  bool local_141;
  bool local_131;
  bool local_121;
  bool local_111;
  bool local_f9;
  bool local_e9;
  bool local_d9;
  bool local_c9;
  bool local_b9;
  bool local_1;
  
  local_1cc = *in_RSI;
  uVar14 = in_RSI[1];
  if ((int)local_1cc < 0) {
    uVar4 = std::__cxx11::string::c_str();
    highsLogUser(in_RDX,kError,"LP dimension validation (%s) fails on num_col = %d >= 0\n",uVar4,
                 (ulong)local_1cc);
  }
  if ((int)uVar14 < 0) {
    uVar4 = std::__cxx11::string::c_str();
    highsLogUser(in_RDX,kError,"LP dimension validation (%s) fails on num_row = %d >= 0\n",uVar4,
                 (ulong)uVar14);
  }
  local_b9 = -1 < (int)uVar14 && -1 < (int)local_1cc;
  if (local_b9) {
    sVar5 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_RSI + 2));
    sVar6 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_RSI + 8));
    sVar7 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_RSI + 0xe));
    bVar8 = (int)local_1cc <= (int)sVar5;
    bVar11 = (int)local_1cc <= (int)sVar6;
    bVar9 = (int)local_1cc <= (int)sVar7;
    if (!bVar8) {
      uVar4 = std::__cxx11::string::c_str();
      highsLogUser(in_RDX,kError,
                   "LP dimension validation (%s) fails on col_cost.size() = %d < %d = num_col\n",
                   uVar4,sVar5 & 0xffffffff,(ulong)local_1cc);
    }
    local_c9 = false;
    if (bVar8) {
      local_c9 = local_b9;
    }
    if (!bVar11) {
      uVar4 = std::__cxx11::string::c_str();
      highsLogUser(in_RDX,kError,
                   "LP dimension validation (%s) fails on col_lower.size() = %d < %d = num_col\n",
                   uVar4,sVar6 & 0xffffffff,(ulong)local_1cc);
    }
    local_d9 = false;
    if (bVar11) {
      local_d9 = local_c9;
    }
    if (!bVar9) {
      uVar4 = std::__cxx11::string::c_str();
      highsLogUser(in_RDX,kError,
                   "LP dimension validation (%s) fails on col_upper.size() = %d < %d = num_col\n",
                   uVar4,sVar7 & 0xffffffff,(ulong)local_1cc);
    }
    local_e9 = false;
    if (bVar9) {
      local_e9 = local_d9;
    }
    bVar8 = true;
    if (in_RSI[0x20] != 1) {
      bVar8 = in_RSI[0x20] == 2;
    }
    if (!bVar8) {
      uVar4 = std::__cxx11::string::c_str();
      highsLogUser(in_RDX,kError,"LP dimension validation (%s) fails on a_matrix_.format\n",uVar4);
    }
    local_f9 = false;
    if (bVar8) {
      local_f9 = local_e9;
    }
    HighsSparseMatrix::isColwise((HighsSparseMatrix *)(in_RSI + 0x20));
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x4f6293);
    uVar13 = (undefined4)((ulong)(in_RSI + 0x36) >> 0x20);
    HVar3 = assessMatrixDimensions
                      ((HighsLogOptions *)
                       CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                       (HighsInt)((ulong)in_stack_fffffffffffffe50 >> 0x20),
                       SUB81((ulong)in_stack_fffffffffffffe50 >> 0x18,0),in_stack_fffffffffffffe48,
                       in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe70
                      );
    if (HVar3 != kOk) {
      uVar4 = std::__cxx11::string::c_str();
      highsLogUser(in_RDX,kError,"LP dimension validation (%s) fails on a_matrix dimensions\n",uVar4
                  );
    }
    local_111 = false;
    if (HVar3 == kOk) {
      local_111 = local_f9;
    }
    sVar5 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x14));
    sVar6 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x1a));
    bVar8 = (int)uVar14 <= (int)sVar5;
    bVar11 = (int)uVar14 <= (int)sVar6;
    if (!bVar8) {
      uVar4 = std::__cxx11::string::c_str();
      highsLogUser(in_RDX,kError,
                   "LP dimension validation (%s) fails on row_lower.size() = %d < %d = num_row\n",
                   uVar4,sVar5 & 0xffffffff,(ulong)uVar14);
    }
    local_121 = false;
    if (bVar8) {
      local_121 = local_111;
    }
    if (!bVar11) {
      uVar4 = std::__cxx11::string::c_str();
      highsLogUser(in_RDX,kError,
                   "LP dimension validation (%s) fails on row_upper.size() = %d < %d = num_row\n",
                   uVar4,sVar6 & 0xffffffff,(ulong)uVar14);
    }
    local_131 = false;
    if (bVar11) {
      local_131 = local_121;
    }
    uVar1 = in_RSI[0x21];
    uVar2 = in_RSI[0x22];
    if (uVar1 != local_1cc) {
      uVar4 = std::__cxx11::string::c_str();
      highsLogUser(in_RDX,kError,
                   "LP dimension validation (%s) fails on a_matrix.num_col_ = %d != %d = num_col\n",
                   uVar4,(ulong)in_RSI[0x21],(ulong)local_1cc);
    }
    local_141 = false;
    if (uVar1 == local_1cc) {
      local_141 = local_131;
    }
    if (uVar2 != uVar14) {
      uVar4 = std::__cxx11::string::c_str();
      highsLogUser(in_RDX,kError,
                   "LP dimension validation (%s) fails on a_matrix.num_row_ = %d != %d = num_row\n",
                   uVar4,(ulong)in_RSI[0x22],(ulong)uVar14);
    }
    local_151 = false;
    if (uVar2 == uVar14) {
      local_151 = local_141;
    }
    uVar1 = in_RSI[0x82];
    if (-1 >= (int)uVar1) {
      uVar4 = std::__cxx11::string::c_str();
      highsLogUser(in_RDX,kError,"LP dimension validation (%s) fails on scale_.scale_strategy\n",
                   uVar4);
    }
    local_161 = false;
    if (-1 < (int)uVar1) {
      local_161 = local_151;
    }
    sVar5 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x8e));
    sVar6 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x88));
    if ((in_RSI[0x83] & 1) == 0) {
      bVar9 = in_RSI[0x84] == 0;
      bVar10 = in_RSI[0x85] == 0;
      bVar8 = (int)sVar5 == 0;
      bVar11 = (int)sVar6 == 0;
    }
    else {
      bVar9 = in_RSI[0x84] == local_1cc;
      bVar10 = in_RSI[0x85] == uVar14;
      bVar8 = (int)uVar14 <= (int)sVar5;
      bVar11 = (int)local_1cc <= (int)sVar6;
    }
    if (!bVar9) {
      uVar4 = std::__cxx11::string::c_str();
      local_17c = local_1cc;
      if ((in_RSI[0x83] & 1) == 0) {
        local_17c = 0;
      }
      highsLogUser(in_RDX,kError,"LP dimension validation (%s) fails on scale_.num_col = %d != %d\n"
                   ,uVar4,(ulong)in_RSI[0x84],(ulong)local_17c);
    }
    local_17d = false;
    if (bVar9) {
      local_17d = local_161;
    }
    if (!bVar10) {
      uVar4 = std::__cxx11::string::c_str();
      local_19c = uVar14;
      if ((in_RSI[0x83] & 1) == 0) {
        local_19c = 0;
      }
      highsLogUser(in_RDX,kError,"LP dimension validation (%s) fails on scale_.num_row = %d != %d\n"
                   ,uVar4,(ulong)in_RSI[0x85],(ulong)local_19c);
    }
    local_19d = false;
    if (bVar10) {
      local_19d = local_17d;
    }
    if (!bVar11) {
      log_options_ = in_RDX;
      uVar4 = std::__cxx11::string::c_str();
      if ((in_RSI[0x83] & 1) == 0) {
        pcVar15 = "==";
      }
      else {
        pcVar15 = ">=";
      }
      if ((in_RSI[0x83] & 1) == 0) {
        local_1cc = 0;
      }
      uVar12 = CONCAT44(uVar13,local_1cc);
      highsLogUser(log_options_,kError,
                   "LP dimension validation (%s) fails on scale_.col.size() = %d %s %d\n",uVar4,
                   sVar6 & 0xffffffff,pcVar15,uVar12);
      uVar13 = (undefined4)((ulong)uVar12 >> 0x20);
    }
    local_1cd = false;
    if (bVar11) {
      local_1cd = local_19d;
    }
    if (!bVar8) {
      uVar4 = std::__cxx11::string::c_str();
      if ((in_RSI[0x83] & 1) == 0) {
        local_1f0 = "==";
      }
      else {
        local_1f0 = ">=";
      }
      in_stack_fffffffffffffe04 = uVar14;
      if ((in_RSI[0x83] & 1) == 0) {
        in_stack_fffffffffffffe04 = 0;
      }
      highsLogUser(in_RDX,kError,
                   "LP dimension validation (%s) fails on scale_.row.size() = %d %s %d\n",uVar4,
                   sVar5 & 0xffffffff,local_1f0,CONCAT44(uVar13,in_stack_fffffffffffffe04));
    }
    uVar14 = in_stack_fffffffffffffe00 & 0xffffff;
    if (bVar8) {
      uVar14 = CONCAT13(local_1cd,(int3)in_stack_fffffffffffffe00);
    }
    local_1 = SUB41(uVar14 >> 0x18,0);
    if ((uVar14 & 0x1000000) == 0) {
      uVar4 = std::__cxx11::string::c_str();
      highsLogUser(in_RDX,kError,"LP dimension validation (%s) fails\n",uVar4);
    }
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)CONCAT44(in_stack_fffffffffffffe04,uVar14));
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool lpDimensionsOk(std::string message, const HighsLp& lp,
                    const HighsLogOptions& log_options) {
  bool ok = true;
  const HighsInt num_col = lp.num_col_;
  const HighsInt num_row = lp.num_row_;
  if (!(num_col >= 0))
    highsLogUser(log_options, HighsLogType::kError,
                 "LP dimension validation (%s) fails on num_col = %d >= 0\n",
                 message.c_str(), (int)num_col);
  ok = num_col >= 0 && ok;
  if (!(num_row >= 0))
    highsLogUser(log_options, HighsLogType::kError,
                 "LP dimension validation (%s) fails on num_row = %d >= 0\n",
                 message.c_str(), (int)num_row);
  ok = num_row >= 0 && ok;
  if (!ok) return ok;

  HighsInt col_cost_size = lp.col_cost_.size();
  HighsInt col_lower_size = lp.col_lower_.size();
  HighsInt col_upper_size = lp.col_upper_.size();
  bool legal_col_cost_size = col_cost_size >= num_col;
  bool legal_col_lower_size = col_lower_size >= num_col;
  bool legal_col_upper_size = col_upper_size >= num_col;
  if (!legal_col_cost_size)
    highsLogUser(log_options, HighsLogType::kError,
                 "LP dimension validation (%s) fails on col_cost.size() = %d < "
                 "%d = num_col\n",
                 message.c_str(), (int)col_cost_size, (int)num_col);
  ok = legal_col_cost_size && ok;
  if (!legal_col_lower_size)
    highsLogUser(log_options, HighsLogType::kError,
                 "LP dimension validation (%s) fails on col_lower.size() = %d "
                 "< %d = num_col\n",
                 message.c_str(), (int)col_lower_size, (int)num_col);
  ok = legal_col_lower_size && ok;
  if (!legal_col_upper_size)
    highsLogUser(log_options, HighsLogType::kError,
                 "LP dimension validation (%s) fails on col_upper.size() = %d "
                 "< %d = num_col\n",
                 message.c_str(), (int)col_upper_size, (int)num_col);
  ok = legal_col_upper_size && ok;

  bool legal_format = lp.a_matrix_.format_ == MatrixFormat::kColwise ||
                      lp.a_matrix_.format_ == MatrixFormat::kRowwise;
  if (!legal_format)
    highsLogUser(log_options, HighsLogType::kError,
                 "LP dimension validation (%s) fails on a_matrix_.format\n",
                 message.c_str());
  ok = legal_format && ok;
  HighsInt num_vec;
  if (lp.a_matrix_.isColwise()) {
    num_vec = num_col;
  } else {
    num_vec = num_row;
  }
  const bool partitioned = false;
  vector<HighsInt> a_matrix_p_end;
  bool legal_matrix_dimensions =
      assessMatrixDimensions(log_options, num_vec, partitioned,
                             lp.a_matrix_.start_, a_matrix_p_end,
                             lp.a_matrix_.index_,
                             lp.a_matrix_.value_) == HighsStatus::kOk;
  if (!legal_matrix_dimensions)
    highsLogUser(log_options, HighsLogType::kError,
                 "LP dimension validation (%s) fails on a_matrix dimensions\n",
                 message.c_str());
  ok = legal_matrix_dimensions && ok;

  HighsInt row_lower_size = lp.row_lower_.size();
  HighsInt row_upper_size = lp.row_upper_.size();
  bool legal_row_lower_size = row_lower_size >= num_row;
  bool legal_row_upper_size = row_upper_size >= num_row;
  if (!legal_row_lower_size)
    highsLogUser(log_options, HighsLogType::kError,
                 "LP dimension validation (%s) fails on row_lower.size() = %d "
                 "< %d = num_row\n",
                 message.c_str(), (int)row_lower_size, (int)num_row);
  ok = legal_row_lower_size && ok;
  if (!legal_row_upper_size)
    highsLogUser(log_options, HighsLogType::kError,
                 "LP dimension validation (%s) fails on row_upper.size() = %d "
                 "< %d = num_row\n",
                 message.c_str(), (int)row_upper_size, (int)num_row);
  ok = legal_row_upper_size && ok;

  bool legal_a_matrix_num_col = lp.a_matrix_.num_col_ == num_col;
  bool legal_a_matrix_num_row = lp.a_matrix_.num_row_ == num_row;
  if (!legal_a_matrix_num_col)
    highsLogUser(log_options, HighsLogType::kError,
                 "LP dimension validation (%s) fails on a_matrix.num_col_ = %d "
                 "!= %d = num_col\n",
                 message.c_str(), (int)lp.a_matrix_.num_col_, (int)num_col);
  ok = legal_a_matrix_num_col && ok;
  if (!legal_a_matrix_num_row)
    highsLogUser(log_options, HighsLogType::kError,
                 "LP dimension validation (%s) fails on a_matrix.num_row_ = %d "
                 "!= %d = num_row\n",
                 message.c_str(), (int)lp.a_matrix_.num_row_, (int)num_row);
  ok = legal_a_matrix_num_row && ok;

  HighsInt scale_strategy = (HighsInt)lp.scale_.strategy;
  bool legal_scale_strategy = scale_strategy >= 0;
  if (!legal_scale_strategy)
    highsLogUser(
        log_options, HighsLogType::kError,
        "LP dimension validation (%s) fails on scale_.scale_strategy\n",
        message.c_str());
  ok = legal_scale_strategy && ok;
  HighsInt scale_row_size = (HighsInt)lp.scale_.row.size();
  HighsInt scale_col_size = (HighsInt)lp.scale_.col.size();
  bool legal_scale_num_col = false;
  bool legal_scale_num_row = false;
  bool legal_scale_row_size = false;
  bool legal_scale_col_size = false;
  if (lp.scale_.has_scaling) {
    legal_scale_num_col = lp.scale_.num_col == num_col;
    legal_scale_num_row = lp.scale_.num_row == num_row;
    legal_scale_row_size = scale_row_size >= num_row;
    legal_scale_col_size = scale_col_size >= num_col;
  } else {
    legal_scale_num_col = lp.scale_.num_col == 0;
    legal_scale_num_row = lp.scale_.num_row == 0;
    legal_scale_row_size = scale_row_size == 0;
    legal_scale_col_size = scale_col_size == 0;
  }
  if (!legal_scale_num_col)
    highsLogUser(
        log_options, HighsLogType::kError,
        "LP dimension validation (%s) fails on scale_.num_col = %d != %d\n",
        message.c_str(), (int)lp.scale_.num_col,
        (int)(lp.scale_.has_scaling ? num_col : 0));
  ok = legal_scale_num_col && ok;
  if (!legal_scale_num_row)
    highsLogUser(
        log_options, HighsLogType::kError,
        "LP dimension validation (%s) fails on scale_.num_row = %d != %d\n",
        message.c_str(), (int)lp.scale_.num_row,
        (int)(lp.scale_.has_scaling ? num_row : 0));
  ok = legal_scale_num_row && ok;
  if (!legal_scale_col_size)
    highsLogUser(
        log_options, HighsLogType::kError,
        "LP dimension validation (%s) fails on scale_.col.size() = %d %s %d\n",
        message.c_str(), (int)scale_col_size,
        lp.scale_.has_scaling ? ">=" : "==",
        (int)(lp.scale_.has_scaling ? num_col : 0));
  ok = legal_scale_col_size && ok;
  if (!legal_scale_row_size)
    highsLogUser(
        log_options, HighsLogType::kError,
        "LP dimension validation (%s) fails on scale_.row.size() = %d %s %d\n",
        message.c_str(), (int)scale_row_size,
        lp.scale_.has_scaling ? ">=" : "==",
        (int)(lp.scale_.has_scaling ? num_row : 0));
  ok = legal_scale_row_size && ok;
  if (!ok) {
    highsLogUser(log_options, HighsLogType::kError,
                 "LP dimension validation (%s) fails\n", message.c_str());
  }

  return ok;
}